

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O2

poptItem poptFreeItems(poptItem items,int nitems)

{
  poptItem in_RAX;
  poptItem extraout_RAX;
  poptItem ppVar1;
  
  ppVar1 = items;
  if (items == (poptItem)0x0) {
    return in_RAX;
  }
  for (; 0 < nitems; nitems = nitems + -1) {
    free((ppVar1->option).longName);
    (ppVar1->option).longName = (char *)0x0;
    free((ppVar1->option).descrip);
    (ppVar1->option).descrip = (char *)0x0;
    free((ppVar1->option).argDescrip);
    (ppVar1->option).argDescrip = (char *)0x0;
    free(ppVar1->argv);
    ppVar1->argv = (char **)0x0;
    ppVar1 = ppVar1 + 1;
  }
  free(items);
  return extraout_RAX;
}

Assistant:

static
poptItem poptFreeItems(poptItem items, int nitems)
{
    if (items != NULL) {
	poptItem item = items;
	while (--nitems >= 0) {
	    item->option.longName = _free(item->option.longName);
	    item->option.descrip = _free(item->option.descrip);
	    item->option.argDescrip = _free(item->option.argDescrip);
	    item->argv = _free(item->argv);
	    item++;
	}
	_free(items);
    }
    return NULL;
}